

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3122:33)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3122:33)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  uint32_t uVar4;
  time_t tVar5;
  long *plVar6;
  ulong *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  Optional<unsigned_int> parsedSeed;
  string local_d0;
  ulong *local_b0;
  undefined8 local_a8;
  ulong local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  uint32_t *local_40 [2];
  
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_assign((string *)&local_d0);
  local_68 = 0;
  local_70 = &PTR__BasicResult_001b2540;
  local_58 = 0;
  local_50 = 0;
  local_60 = &local_50;
  iVar3 = std::__cxx11::string::compare((char *)&local_d0);
  if (iVar3 == 0) {
    tVar5 = time((time_t *)0x0);
    ((this->m_lambda).config)->rngSeed = (uint32_t)tVar5;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar3 == 0) {
      uVar4 = generateRandomSeed(RandomDevice);
    }
    else {
      parseUInt((Catch *)local_40,&local_d0,0);
      if (local_40[0] == (uint32_t *)0x0) {
        std::operator+(&local_90,"Could not parse \'",&local_d0);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        puVar7 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar7) {
          local_a0 = *puVar7;
          lStack_98 = plVar6[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *puVar7;
          local_b0 = (ulong *)*plVar6;
        }
        sVar2 = plVar6[1];
        *plVar6 = (long)puVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
        super_ResultBase.m_type = RuntimeError;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
        paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
        if (local_b0 == &local_a0) {
          paVar1->_M_allocated_capacity = local_a0;
          *(long *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = lStack_98;
        }
        else {
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)local_b0;
          (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = local_a0;
        }
        (__return_storage_ptr__->m_errorMessage)._M_string_length = sVar2;
        local_a8 = 0;
        local_a0 = local_a0 & 0xffffffffffffff00;
        local_b0 = &local_a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00161ea3;
      }
      uVar4 = *local_40[0];
    }
    ((this->m_lambda).config)->rngSeed = uVar4;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  }
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_00161ea3:
  local_70 = &PTR__BasicResult_001b2540;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }